

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::rebind::test_method(rebind *this)

{
  int iVar1;
  service *psVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  injected<Inject::service> p2;
  component<Inject::impl2> y;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  undefined **local_150;
  undefined1 local_148;
  undefined8 *local_140;
  char *local_138;
  unique_id local_130;
  injected<Inject::service> p;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  unique_id local_f8;
  provides<Inject::service> yy;
  provides<Inject::service> xxx;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::impl1>::component(&xx);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&xxx);
  inject::context<0>::component<Inject::impl2>::component(&y);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides(&yy);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::injected<Inject::service>::injected(&p);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0xe1);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_0015fea8;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_100 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&p);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  p2._ptr.px = (element_type *)CONCAT44(extraout_var,iVar1);
  local_130 = inject::id_of<Inject::impl1>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_150,&local_108,0xe1,1,2,&p2,"p->id()",&local_130,"id_of<impl1>::id()");
  inject::context<0>::bind<Inject::service,Inject::impl2,(inject::component_scope)0>(&c);
  inject::context<0>::injected<Inject::service>::injected(&p2);
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_c8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0xe5);
  local_148 = 0;
  local_150 = &PTR__lazy_ostream_0015fea8;
  local_140 = &boost::unit_test::lazy_ostream::inst;
  local_138 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_110 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&p2);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_130 = CONCAT44(extraout_var_00,iVar1);
  local_f8 = inject::id_of<Inject::impl2>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_150,&local_118,0xe5,1,2,&local_130,"p2->id()",&local_f8,"id_of<impl2>::id()");
  boost::detail::shared_count::~shared_count(&p2._ptr.pn);
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::impl2>::~component(&y);
  inject::context<0>::component<Inject::impl1>::~component(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rebind)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;
    context<>::component<impl2> y;
    context<>::component<impl2>::provides<service> yy;

    context<> c;
    c.bind<service, impl1>();
    context<>::injected<service> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());
    
    c.bind<service, impl2>();
    context<>::injected<service> p2;
    BOOST_CHECK_EQUAL(p2->id(), id_of<impl2>::id());
}